

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createGeometryPointSizeTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  Flags flags;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  undefined1 local_78 [8];
  string desc;
  string name;
  DefaultDeleter<tcu::TestCaseGroup> local_2d;
  int ndx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"point_size","Test point size");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar1
            );
  uVar2 = extraout_RDX;
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 7;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    (anonymous_namespace)::getTestCaseName_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (_anonymous_namespace_ *)
               (ulong)createGeometryPointSizeTests::caseFlags[(int)name.field_2._12_4_],(Flags)uVar2
              );
    (anonymous_namespace)::getTestCaseDescription_abi_cxx11_
              ((string *)local_78,
               (_anonymous_namespace_ *)
               (ulong)createGeometryPointSizeTests::caseFlags[(int)name.field_2._12_4_],flags);
    pTVar1 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20
                );
    addFunctionCaseWithPrograms<unsigned_int>
              (pTVar1,(string *)((long)&desc.field_2 + 8),(string *)local_78,
               anon_unknown_1::initPrograms,anon_unknown_1::test,
               createGeometryPointSizeTests::caseFlags[(int)name.field_2._12_4_]);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    uVar2 = extraout_RDX_00;
  }
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createGeometryPointSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "point_size", "Test point size"));

	static const Flags caseFlags[] =
	{
		FLAG_VERTEX_SET,
							FLAG_TESSELLATION_EVALUATION_SET,
																	FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_EVALUATION_SET,
		FLAG_VERTEX_SET |											FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_EVALUATION_SET	|	FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_ADD				|	FLAG_GEOMETRY_ADD,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(caseFlags); ++ndx)
	{
		const std::string name = getTestCaseName       (caseFlags[ndx]);
		const std::string desc = getTestCaseDescription(caseFlags[ndx]);

		addFunctionCaseWithPrograms(group.get(), name, desc, initPrograms, test, caseFlags[ndx]);
	}

	return group.release();
}